

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O2

void __thiscall
trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::step
          (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->S).index;
  uVar2 = uVar1 + 1 & 0x3ff;
  (this->S).index = uVar2;
  (this->S).r[uVar2] =
       (this->S).r[uVar1 + 0x334 & 0x3ff] ^ (this->S).r[uVar1 + 0x359 & 0x3ff] ^
       (this->S).r[uVar1 + 0x30f & 0x3ff] ^ (this->S).r[uVar1 + 0x1f8 & 0x3ff];
  return;
}

Assistant:

void step() {
      constexpr auto mask_D{int_math::mask(static_cast<decltype(S.index)>(D))};
      ++S.index;
      S.index &= mask_D;
      S.r[S.index] = S.r[(S.index - A) & mask_D] ^ S.r[(S.index - B) & mask_D] ^
                     S.r[(S.index - C) & mask_D] ^ S.r[(S.index - D) & mask_D];
    }